

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_benchmark.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_bc6e::read_iostream_prealloc
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          char *file_name)

{
  long lVar1;
  size_type __n;
  ifstream file;
  undefined1 auStack_228 [7];
  allocator_type local_221;
  long local_220 [3];
  undefined4 auStack_204 [123];
  
  std::ifstream::ifstream(local_220);
  lVar1 = *(long *)(local_220[0] + -0x18);
  *(undefined4 *)((long)auStack_204 + lVar1) = 1;
  std::ios::clear((int)auStack_228 + (int)lVar1 + 8);
  std::ifstream::open((char *)local_220,(_Ios_Openmode)file_name);
  std::istream::seekg((long)local_220,_S_beg);
  __n = std::istream::tellg();
  std::istream::seekg(local_220,0,0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,__n,&local_221);
  std::istream::read((char *)local_220,
                     (long)(__return_storage_ptr__->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start);
  std::ifstream::~ifstream(local_220);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> read_iostream_prealloc(const char* file_name)
{
    std::ifstream file{};
    file.exceptions(std::ios::badbit);
    file.open(file_name, std::ios_base::binary);

    file.seekg(0, std::ios_base::end);
    auto file_size = file.tellg();
    file.seekg(0);
    std::vector<std::uint8_t> output(file_size);

    file.read(reinterpret_cast<char*>(output.data()), file_size);

    return output;
}